

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::vector
          (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this,
          vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *other)

{
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *other_local;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this_local;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (RGB *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  this->nStored = other->nStored;
  this->nAlloc = other->nAlloc;
  this->ptr = other->ptr;
  other->nAlloc = 0;
  other->nStored = 0;
  other->ptr = (RGB *)0x0;
  return;
}

Assistant:

vector(vector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;

        other.nStored = other.nAlloc = 0;
        other.ptr = nullptr;
    }